

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice_detection_impl.cc
# Opt level: O0

int __thiscall
webrtc::VoiceDetectionImpl::set_likelihood(VoiceDetectionImpl *this,Likelihood likelihood)

{
  ostream *poVar1;
  pointer this_00;
  VadInst *handle;
  FatalMessage local_338;
  string *local_1c0;
  string *_result;
  undefined1 local_1b0 [4];
  int error;
  FatalMessageVoidify local_25;
  int local_24;
  int mode;
  CritScope cs;
  Likelihood likelihood_local;
  VoiceDetectionImpl *this_local;
  
  cs.cs_._4_4_ = likelihood;
  rtc::CritScope::CritScope((CritScope *)&stack0xffffffffffffffe0,this->crit_);
  this->likelihood_ = cs.cs_._4_4_;
  if ((this->enabled_ & 1U) != 0) {
    local_24 = 2;
    switch(cs.cs_._4_4_) {
    case kVeryLowLikelihood:
      local_24 = 3;
      break;
    case kLowLikelihood:
      local_24 = 2;
      break;
    case kModerateLikelihood:
      local_24 = 1;
      break;
    case kHighLikelihood:
      local_24 = 0;
      break;
    default:
      rtc::FatalMessageVoidify::FatalMessageVoidify(&local_25);
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
                 ,0x80);
      poVar1 = rtc::FatalMessage::stream((FatalMessage *)local_1b0);
      poVar1 = std::operator<<(poVar1,"Check failed: false");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<(poVar1,"# ");
      rtc::FatalMessageVoidify::operator&(&local_25,poVar1);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)local_1b0);
    }
    this_00 = std::
              unique_ptr<webrtc::VoiceDetectionImpl::Vad,_std::default_delete<webrtc::VoiceDetectionImpl::Vad>_>
              ::operator->(&this->vad_);
    handle = Vad::state(this_00);
    _result._4_4_ = WebRtcVad_set_mode(handle,local_24);
    local_1c0 = rtc::CheckEQImpl_abi_cxx11_(0,_result._4_4_,"0 == error");
    if (local_1c0 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_338,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
                 ,0x84,local_1c0);
      rtc::FatalMessage::stream(&local_338);
      rtc::FatalMessage::~FatalMessage(&local_338);
    }
    local_1c0 = (string *)0x0;
  }
  rtc::CritScope::~CritScope((CritScope *)&stack0xffffffffffffffe0);
  return 0;
}

Assistant:

int VoiceDetectionImpl::set_likelihood(VoiceDetection::Likelihood likelihood) {
  rtc::CritScope cs(crit_);
  likelihood_ = likelihood;
  if (enabled_) {
    int mode = 2;
    switch (likelihood) {
      case VoiceDetection::kVeryLowLikelihood:
        mode = 3;
        break;
      case VoiceDetection::kLowLikelihood:
        mode = 2;
        break;
      case VoiceDetection::kModerateLikelihood:
        mode = 1;
        break;
      case VoiceDetection::kHighLikelihood:
        mode = 0;
        break;
      default:
        RTC_NOTREACHED();
        break;
    }
    int error = WebRtcVad_set_mode(vad_->state(), mode);
    RTC_DCHECK_EQ(0, error);
  }
  return AudioProcessing::kNoError;
}